

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O1

int TRUST_TOKEN_ISSUER_issue
              (TRUST_TOKEN_ISSUER *ctx,uint8_t **out,size_t *out_len,size_t *out_tokens_issued,
              uint8_t *request,size_t request_len,uint32_t public_metadata,uint8_t private_metadata,
              size_t max_issuance)

{
  int iVar1;
  size_t sVar2;
  trust_token_issuer_key_st *ptVar3;
  int iVar4;
  ulong uVar5;
  uint16_t num_requested;
  CBS in;
  CBB response;
  ushort local_8a;
  size_t *local_88;
  uint8_t **local_80;
  size_t *local_78;
  CBS local_70;
  CBB local_60;
  
  if (ctx->max_batchsize < max_issuance) {
    max_issuance = (ulong)ctx->max_batchsize;
  }
  sVar2 = ctx->num_keys;
  if (sVar2 != 0) {
    ptVar3 = ctx->keys;
    do {
      if (ptVar3->id == public_metadata) goto LAB_001a731d;
      ptVar3 = ptVar3 + 1;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  ptVar3 = (trust_token_issuer_key_st *)0x0;
LAB_001a731d:
  if ((private_metadata < 2 && ptVar3 != (trust_token_issuer_key_st *)0x0) &&
     ((private_metadata == '\0' || (ctx->method->has_private_metadata != 0)))) {
    local_80 = out;
    local_78 = out_len;
    local_70.data = request;
    local_70.len = request_len;
    iVar1 = CBS_get_u16(&local_70,&local_8a);
    if (iVar1 != 0) {
      uVar5 = (ulong)local_8a;
      if (max_issuance < local_8a) {
        uVar5 = max_issuance;
      }
      iVar4 = 0;
      local_88 = out_tokens_issued;
      iVar1 = CBB_init(&local_60,0);
      if ((((iVar1 != 0) && (iVar1 = CBB_add_u16(&local_60,(uint16_t)uVar5), iVar1 != 0)) &&
          (iVar1 = CBB_add_u32(&local_60,public_metadata), iVar1 != 0)) &&
         (iVar1 = (*ctx->method->sign)
                            (&ptVar3->key,&local_60,&local_70,(size_t)local_8a,uVar5,
                             private_metadata), iVar1 != 0)) {
        if (local_70.len == 0) {
          iVar1 = CBB_finish(&local_60,local_80,local_78);
          if (iVar1 != 0) {
            *local_88 = uVar5;
            iVar4 = 1;
          }
        }
        else {
          iVar4 = 0;
          ERR_put_error(0x20,0,0x69,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                        ,0x232);
        }
      }
      CBB_cleanup(&local_60);
      return iVar4;
    }
    iVar1 = 0x69;
    iVar4 = 0x21c;
  }
  else {
    iVar1 = 0x6a;
    iVar4 = 0x214;
  }
  ERR_put_error(0x20,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/trust_token.cc"
                ,iVar4);
  return 0;
}

Assistant:

int TRUST_TOKEN_ISSUER_issue(const TRUST_TOKEN_ISSUER *ctx, uint8_t **out,
                             size_t *out_len, size_t *out_tokens_issued,
                             const uint8_t *request, size_t request_len,
                             uint32_t public_metadata, uint8_t private_metadata,
                             size_t max_issuance) {
  if (max_issuance > ctx->max_batchsize) {
    max_issuance = ctx->max_batchsize;
  }

  const struct trust_token_issuer_key_st *key =
      trust_token_issuer_get_key(ctx, public_metadata);
  if (key == NULL || private_metadata > 1 ||
      (!ctx->method->has_private_metadata && private_metadata != 0)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_INVALID_METADATA);
    return 0;
  }

  CBS in;
  uint16_t num_requested;
  CBS_init(&in, request, request_len);
  if (!CBS_get_u16(&in, &num_requested)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    return 0;
  }

  size_t num_to_issue = num_requested;
  if (num_to_issue > max_issuance) {
    num_to_issue = max_issuance;
  }

  int ret = 0;
  CBB response;
  if (!CBB_init(&response, 0) || !CBB_add_u16(&response, num_to_issue) ||
      !CBB_add_u32(&response, public_metadata)) {
    goto err;
  }

  if (!ctx->method->sign(&key->key, &response, &in, num_requested, num_to_issue,
                         private_metadata)) {
    goto err;
  }

  if (CBS_len(&in) != 0) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_DECODE_FAILURE);
    goto err;
  }

  if (!CBB_finish(&response, out, out_len)) {
    goto err;
  }

  *out_tokens_issued = num_to_issue;
  ret = 1;

err:
  CBB_cleanup(&response);
  return ret;
}